

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformationData.cpp
# Opt level: O3

void __thiscall TransformationData::rollforward(TransformationData *this)

{
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar1;
  Vec2d *this_00;
  
  Quad::deleteQuads(this->previousQuads,true);
  operator_delete(this->previousOffset);
  pvVar1 = Quad::cloneQuads(this->workingQuads);
  this->previousQuads = pvVar1;
  this->previousRotation = this->workingRotation;
  this_00 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_00,this->workingOffset);
  this->previousOffset = this_00;
  return;
}

Assistant:

void TransformationData::rollforward() {
    Quad::deleteQuads(previousQuads, true);
    delete previousOffset;
    
    previousQuads = Quad::cloneQuads(workingQuads);
    previousRotation = workingRotation;
    previousOffset = new Vec2d(workingOffset);
}